

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt_utils.h
# Opt level: O2

void set_tx_domain_dist_params
               (WinnerModeParams *winner_mode_params,TxfmSearchParams *txfm_params,
               int enable_winner_mode_for_tx_domain_dist,int is_winner_mode)

{
  uint uVar1;
  
  if (txfm_params->use_qm_dist_metric != 0) {
    txfm_params->use_transform_domain_distortion = 1;
    txfm_params->tx_domain_dist_threshold = 0;
    return;
  }
  if (enable_winner_mode_for_tx_domain_dist == 0) {
    txfm_params->use_transform_domain_distortion =
         winner_mode_params->use_transform_domain_distortion[0];
    uVar1 = winner_mode_params->tx_domain_dist_threshold[0];
  }
  else if (is_winner_mode == 0) {
    txfm_params->use_transform_domain_distortion =
         winner_mode_params->use_transform_domain_distortion[1];
    uVar1 = winner_mode_params->tx_domain_dist_threshold[1];
  }
  else {
    txfm_params->use_transform_domain_distortion =
         winner_mode_params->use_transform_domain_distortion[2];
    uVar1 = winner_mode_params->tx_domain_dist_threshold[2];
  }
  txfm_params->tx_domain_dist_threshold = uVar1;
  return;
}

Assistant:

static inline void set_tx_domain_dist_params(
    const WinnerModeParams *winner_mode_params, TxfmSearchParams *txfm_params,
    int enable_winner_mode_for_tx_domain_dist, int is_winner_mode) {
  if (txfm_params->use_qm_dist_metric) {
    // QM-weighted PSNR is computed in transform space, so we need to forcibly
    // enable the use of tx domain distortion.
    txfm_params->use_transform_domain_distortion = 1;
    txfm_params->tx_domain_dist_threshold = 0;
    return;
  }

  if (!enable_winner_mode_for_tx_domain_dist) {
    txfm_params->use_transform_domain_distortion =
        winner_mode_params->use_transform_domain_distortion[DEFAULT_EVAL];
    txfm_params->tx_domain_dist_threshold =
        winner_mode_params->tx_domain_dist_threshold[DEFAULT_EVAL];
    return;
  }

  if (is_winner_mode) {
    txfm_params->use_transform_domain_distortion =
        winner_mode_params->use_transform_domain_distortion[WINNER_MODE_EVAL];
    txfm_params->tx_domain_dist_threshold =
        winner_mode_params->tx_domain_dist_threshold[WINNER_MODE_EVAL];
  } else {
    txfm_params->use_transform_domain_distortion =
        winner_mode_params->use_transform_domain_distortion[MODE_EVAL];
    txfm_params->tx_domain_dist_threshold =
        winner_mode_params->tx_domain_dist_threshold[MODE_EVAL];
  }
}